

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

void __thiscall ixy::IxgbeDevice::start_tx_queue(IxgbeDevice *this,uint16_t queue_id)

{
  undefined2 uVar1;
  reference pvVar2;
  ushort local_2a;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> local_28;
  
  local_28.list.second = &local_2a;
  local_28.list.first.second = "starting tx queue ";
  local_2a = queue_id;
  debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0x107,"start_tx_queue",&local_28);
  pvVar2 = std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::at
                     (&this->tx_queues,(ulong)local_2a);
  uVar1 = pvVar2->num_entries;
  if ((uVar1 & uVar1 - 1) != 0) {
    local_28.list.first.second = "number of queue entries must be a power of 2";
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x10a,"start_tx_queue",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&local_28);
  }
  set_reg32(this,(ulong)local_2a * 0x40 + 0x6010,0);
  set_reg32(this,(ulong)local_2a * 0x40 + 0x6018,0);
  set_flags32(this,(ulong)local_2a * 0x40 + 0x6028,0x2000000);
  wait_set_reg32(this,(ulong)local_2a * 0x40 + 0x6028,0x2000000);
  return;
}

Assistant:

void IxgbeDevice::start_tx_queue(uint16_t queue_id) {
    debug("starting tx queue " << queue_id);
    struct ixgbe_tx_queue *queue = &tx_queues.at(queue_id);
    if (queue->num_entries & unsigned(queue->num_entries - 1)) {
        error("number of queue entries must be a power of 2");
    }
    // tx queue starts out empty
    set_reg32(IXGBE_TDH(queue_id), 0);
    set_reg32(IXGBE_TDT(queue_id), 0);
    // enable queue and wait if necessary
    set_flags32(IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
    wait_set_reg32(IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
}